

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filewatcherpp.hpp
# Opt level: O0

FileWatcherBase * __thiscall
FileWatcherBase::FilterByExtension
          (FileWatcherBase *this,Behavior b,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          extList)

{
  mapped_type *pmVar1;
  Behavior b_local;
  FileWatcherBase *this_local;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extList_local;
  
  if (b == Include) {
    pmVar1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileWatcherBase::ActionDetails,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileWatcherBase::ActionDetails>_>_>
             ::operator[](&this->detailMap,&this->currentPath);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&pmVar1->extInclude,extList);
  }
  else if (b == Exclude) {
    pmVar1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileWatcherBase::ActionDetails,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileWatcherBase::ActionDetails>_>_>
             ::operator[](&this->detailMap,&this->currentPath);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&pmVar1->extExclude,extList);
  }
  return this;
}

Assistant:

FileWatcherBase& FileWatcherBase::FilterByExtension(Behavior b, std::initializer_list<std::string> extList)
{
    switch (b)
    {
        case Behavior::Include:
            detailMap[currentPath].extInclude.insert(extList);

            break;

        case Behavior::Exclude:
            detailMap[currentPath].extExclude.insert(extList);

            break;

        default:
            // 报错
            break;
    }

    return *this;
}